

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_pcnt_df(uint32_t df,int64_t arg)

{
  ulong uVar1;
  uint64_t x;
  int64_t arg_local;
  uint32_t df_local;
  
  uVar1 = arg & 0xffffffffffffffffU >> (0x40U - (char)(1L << ((char)df + 3U & 0x3f)) & 0x3f);
  uVar1 = (uVar1 & 0x5555555555555555) + (uVar1 >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  uVar1 = (uVar1 & 0xf0f0f0f0f0f0f0f) + (uVar1 >> 4 & 0xf0f0f0f0f0f0f0f);
  uVar1 = (uVar1 & 0xff00ff00ff00ff) + (uVar1 >> 8 & 0xff00ff00ff00ff);
  uVar1 = (uVar1 & 0xffff0000ffff) + (uVar1 >> 0x10 & 0xffff0000ffff);
  return (uVar1 & 0xffffffff) + (uVar1 >> 0x20);
}

Assistant:

static inline int64_t msa_pcnt_df(uint32_t df, int64_t arg)
{
    uint64_t x;

    x = UNSIGNED(arg, df);

    x = (x & 0x5555555555555555ULL) + ((x >>  1) & 0x5555555555555555ULL);
    x = (x & 0x3333333333333333ULL) + ((x >>  2) & 0x3333333333333333ULL);
    x = (x & 0x0F0F0F0F0F0F0F0FULL) + ((x >>  4) & 0x0F0F0F0F0F0F0F0FULL);
    x = (x & 0x00FF00FF00FF00FFULL) + ((x >>  8) & 0x00FF00FF00FF00FFULL);
    x = (x & 0x0000FFFF0000FFFFULL) + ((x >> 16) & 0x0000FFFF0000FFFFULL);
    x = (x & 0x00000000FFFFFFFFULL) + ((x >> 32));

    return x;
}